

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpoint.cpp
# Opt level: O0

void pztopology::TPZPoint::ParametricDomainNodeCoord(int node,TPZVec<double> *nodeCoord)

{
  long *in_RSI;
  int in_EDI;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  undefined8 local_18;
  long *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  if (1 < in_EDI) {
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  local_18 = 0;
  (**(code **)(*local_10 + 0x10))(local_10,0,&local_18);
  if (local_4 != 0) {
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  return;
}

Assistant:

void TPZPoint::ParametricDomainNodeCoord(int node, TPZVec<REAL> &nodeCoord)
    {

        if(node > NCornerNodes)
        {
            DebugStop();
        }
        nodeCoord.Resize(Dimension, 0.);
        switch (node) {
            case (0):
            {
                return;
                break;
            }
            default:
            {
                DebugStop();
                break;
            }
        }
    }